

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaStr.c
# Opt level: O0

Gia_Man_t *
Str_NtkBalance(Gia_Man_t *pGia,Str_Ntk_t *p,int nLutSize,int fUseMuxes,int fRecursive,int fOptArea,
              int fVerbose)

{
  long lVar1;
  long lVar2;
  long lVar3;
  Str_Obj_t *pSVar4;
  Gia_Man_t *pGVar5;
  int iVar6;
  int iVar7;
  int iLit0;
  uint uVar8;
  uint uVar9;
  char *pcVar10;
  uint *puVar11;
  Vec_Int_t *pVVar12;
  Gia_Obj_t *pGVar13;
  float fVar14;
  int local_64;
  int local_60;
  int Delay;
  int arrTime;
  int CioId;
  int nMuxes;
  int nGroups;
  Str_Obj_t *pObj;
  Vec_Int_t *vDelay;
  Gia_Man_t *pTemp;
  Gia_Man_t *pNew;
  int fOptArea_local;
  int fRecursive_local;
  int fUseMuxes_local;
  int nLutSize_local;
  Str_Ntk_t *p_local;
  Gia_Man_t *pGia_local;
  
  local_64 = 0;
  pNew._0_4_ = fOptArea;
  pNew._4_4_ = fRecursive;
  fOptArea_local = fUseMuxes;
  fRecursive_local = nLutSize;
  _fUseMuxes_local = p;
  p_local = (Str_Ntk_t *)pGia;
  if (0xf < nLutSize) {
    __assert_fail("nLutSize < 16",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaStr.c"
                  ,0x50e,
                  "Gia_Man_t *Str_NtkBalance(Gia_Man_t *, Str_Ntk_t *, int, int, int, int, int)");
  }
  if (pGia->pMuxes != (uint *)0x0) {
    __assert_fail("pGia->pMuxes == NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaStr.c"
                  ,0x50f,
                  "Gia_Man_t *Str_NtkBalance(Gia_Man_t *, Str_Ntk_t *, int, int, int, int, int)");
  }
  iVar6 = Gia_ManObjNum(pGia);
  pTemp = Gia_ManStart(iVar6);
  pcVar10 = Abc_UtilStrsav(*(char **)p_local);
  pTemp->pName = pcVar10;
  pcVar10 = Abc_UtilStrsav((char *)p_local->pObjs);
  pTemp->pSpec = pcVar10;
  puVar11 = (uint *)calloc((long)pTemp->nObjsAlloc,4);
  pTemp->pMuxes = puVar11;
  Vec_IntFill(&pTemp->vCopies,pTemp->nObjsAlloc,-1);
  if (pTemp->vSuper == (Vec_Int_t *)0x0) {
    pVVar12 = Vec_IntAlloc(1000);
    pTemp->vSuper = pVVar12;
  }
  if (pTemp->vStore == (Vec_Int_t *)0x0) {
    pVVar12 = Vec_IntAlloc(1000);
    pTemp->vStore = pVVar12;
  }
  pObj = (Str_Obj_t *)Vec_IntStart(pTemp->nObjsAlloc << 1);
  Gia_ManHashStart(pTemp);
  lVar1._0_4_ = p_local[9].nObjs;
  lVar1._4_4_ = p_local[9].nObjsAlloc;
  if (lVar1 != 0) {
    Tim_ManInitPiArrivalAll(*(Tim_Man_t **)(p_local + 9),17.0);
    Tim_ManIncrementTravId(*(Tim_Man_t **)(p_local + 9));
  }
  _nMuxes = _fUseMuxes_local->pObjs;
  do {
    iVar6 = Str_ObjId(_fUseMuxes_local,_nMuxes);
    pGVar5 = pTemp;
    if (_fUseMuxes_local->nObjs <= iVar6) {
      if (fVerbose != 0) {
        uVar8 = Gia_ManObjNum((Gia_Man_t *)p_local);
        uVar9 = Gia_ManObjNum(pTemp);
        printf("Max delay = %d.  Old objs = %d.  New objs = %d.\n",(ulong)(uint)(local_64 >> 4),
               (ulong)uVar8,(ulong)uVar9);
      }
      Vec_IntFree((Vec_Int_t *)pObj);
      if ((pTemp->vCopies).pArray != (int *)0x0) {
        free((pTemp->vCopies).pArray);
        (pTemp->vCopies).pArray = (int *)0x0;
      }
      Gia_ManHashStop(pTemp);
      pGVar5 = pTemp;
      iVar6 = Gia_ManRegNum((Gia_Man_t *)p_local);
      Gia_ManSetRegNum(pGVar5,iVar6);
      vDelay = (Vec_Int_t *)pTemp;
      pTemp = Gia_ManDupNoMuxes(pTemp,0);
      Gia_ManStop((Gia_Man_t *)vDelay);
      return pTemp;
    }
    if (((undefined1  [16])*_nMuxes & (undefined1  [16])0xf) == (undefined1  [16])0x2) {
      iVar6 = Gia_ManAppendCi(pTemp);
      pGVar5 = pTemp;
      _nMuxes->iCopy = iVar6;
      local_60 = 0x11;
      lVar2._0_4_ = p_local[9].nObjs;
      lVar2._4_4_ = p_local[9].nObjsAlloc;
      if (lVar2 != 0) {
        iVar6 = Abc_Lit2Var(_nMuxes->iCopy);
        pGVar13 = Gia_ManObj(pGVar5,iVar6);
        iVar6 = Gia_ObjCioId(pGVar13);
        fVar14 = Tim_ManGetCiArrival(*(Tim_Man_t **)(p_local + 9),iVar6);
        local_60 = (int)fVar14;
      }
      pSVar4 = pObj;
      iVar6 = Abc_Lit2Var(_nMuxes->iCopy);
      Vec_IntWriteEntry((Vec_Int_t *)pSVar4,iVar6,local_60);
    }
    else if ((((undefined1  [16])*_nMuxes & (undefined1  [16])0xf) == (undefined1  [16])0x3) ||
            (((undefined1  [16])*_nMuxes & (undefined1  [16])0xf) == (undefined1  [16])0x4)) {
      Str_NtkBalanceMulti(pTemp,_fUseMuxes_local,_nMuxes,(Vec_Int_t *)pObj,fRecursive_local);
    }
    else if (((((undefined1  [16])*_nMuxes & (undefined1  [16])0xf) == (undefined1  [16])0x5) &&
             (-1 < _nMuxes->iTop)) && (fOptArea_local != 0)) {
      Str_ObjReadGroup(_fUseMuxes_local,_nMuxes,&CioId,&arrTime);
      if (CioId * arrTime < 2) {
        __assert_fail("nGroups * nMuxes >= 2",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaStr.c"
                      ,0x532,
                      "Gia_Man_t *Str_NtkBalance(Gia_Man_t *, Str_Ntk_t *, int, int, int, int, int)"
                     );
      }
      Str_NtkBalanceMux(pTemp,_fUseMuxes_local,_nMuxes,(Vec_Int_t *)pObj,fRecursive_local,CioId,
                        arrTime,pNew._4_4_,(int)pNew,fVerbose);
      _nMuxes = _nMuxes + (CioId * arrTime + -1);
    }
    else if (((undefined1  [16])*_nMuxes & (undefined1  [16])0xf) == (undefined1  [16])0x5) {
      iVar6 = Str_ObjFaninCopy(_fUseMuxes_local,_nMuxes,2);
      iVar7 = Str_ObjFaninCopy(_fUseMuxes_local,_nMuxes,1);
      iLit0 = Str_ObjFaninCopy(_fUseMuxes_local,_nMuxes,0);
      iVar6 = Gia_ManHashMuxReal(pGVar5,iVar6,iVar7,iLit0);
      pGVar5 = pTemp;
      _nMuxes->iCopy = iVar6;
      iVar6 = Abc_Lit2Var(_nMuxes->iCopy);
      Str_ObjDelay(pGVar5,iVar6,fRecursive_local,(Vec_Int_t *)pObj);
    }
    else if (((undefined1  [16])*_nMuxes & (undefined1  [16])0xf) == (undefined1  [16])0x7) {
      iVar6 = Str_ObjFaninCopy(_fUseMuxes_local,_nMuxes,0);
      iVar6 = Gia_ManAppendCo(pGVar5,iVar6);
      pSVar4 = pObj;
      _nMuxes->iCopy = iVar6;
      iVar6 = Str_ObjFaninCopy(_fUseMuxes_local,_nMuxes,0);
      iVar6 = Abc_Lit2Var(iVar6);
      iVar6 = Vec_IntEntry((Vec_Int_t *)pSVar4,iVar6);
      local_64 = Abc_MaxInt(local_64,iVar6);
      pGVar5 = pTemp;
      lVar3._0_4_ = p_local[9].nObjs;
      lVar3._4_4_ = p_local[9].nObjsAlloc;
      if (lVar3 != 0) {
        iVar7 = Abc_Lit2Var(_nMuxes->iCopy);
        pGVar13 = Gia_ManObj(pGVar5,iVar7);
        iVar7 = Gia_ObjCioId(pGVar13);
        Tim_ManSetCoArrival(*(Tim_Man_t **)(p_local + 9),iVar7,(float)iVar6);
      }
    }
    else {
      if (((undefined1  [16])*_nMuxes & (undefined1  [16])0xf) != (undefined1  [16])0x1) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaStr.c"
                      ,0x548,
                      "Gia_Man_t *Str_NtkBalance(Gia_Man_t *, Str_Ntk_t *, int, int, int, int, int)"
                     );
      }
      _nMuxes->iCopy = 0;
      Vec_IntWriteEntry((Vec_Int_t *)pObj,0,0x11);
    }
    _nMuxes = _nMuxes + 1;
  } while( true );
}

Assistant:

Gia_Man_t * Str_NtkBalance( Gia_Man_t * pGia, Str_Ntk_t * p, int nLutSize, int fUseMuxes, int fRecursive, int fOptArea, int fVerbose )
{
    Gia_Man_t * pNew, * pTemp;
    Vec_Int_t * vDelay;
    Str_Obj_t * pObj; 
    int nGroups, nMuxes, CioId;
    int arrTime, Delay = 0;
    assert( nLutSize < 16 );
    assert( pGia->pMuxes == NULL );
    pNew = Gia_ManStart( Gia_ManObjNum(pGia) );
    pNew->pName = Abc_UtilStrsav( pGia->pName );
    pNew->pSpec = Abc_UtilStrsav( pGia->pSpec );
    pNew->pMuxes = ABC_CALLOC( unsigned, pNew->nObjsAlloc );
    Vec_IntFill( &pNew->vCopies, pNew->nObjsAlloc, -1 );
    if ( pNew->vSuper == NULL )
        pNew->vSuper = Vec_IntAlloc( 1000 );
    if ( pNew->vStore == NULL )
        pNew->vStore = Vec_IntAlloc( 1000 );
    vDelay = Vec_IntStart( 2*pNew->nObjsAlloc );
    Gia_ManHashStart( pNew );
    if ( pGia->pManTime != NULL ) // Tim_Man with unit delay 16
    {
        Tim_ManInitPiArrivalAll( (Tim_Man_t *)pGia->pManTime, 17 );
        Tim_ManIncrementTravId( (Tim_Man_t *)pGia->pManTime );
    }
    Str_NtkManForEachObj( p, pObj )
    {
        if ( pObj->Type == STR_PI )
        {
            pObj->iCopy = Gia_ManAppendCi( pNew );
            arrTime = 17;
            if ( pGia->pManTime != NULL )
            {
                CioId = Gia_ObjCioId( Gia_ManObj(pNew, Abc_Lit2Var(pObj->iCopy)) );
                arrTime = (int)Tim_ManGetCiArrival( (Tim_Man_t *)pGia->pManTime, CioId );
            }
            Vec_IntWriteEntry( vDelay, Abc_Lit2Var(pObj->iCopy), arrTime );
        }
        else if ( pObj->Type == STR_AND || pObj->Type == STR_XOR )
            Str_NtkBalanceMulti( pNew, p, pObj, vDelay, nLutSize );
        else if ( pObj->Type == STR_MUX && pObj->iTop >= 0 && fUseMuxes )
        {
            Str_ObjReadGroup( p, pObj, &nGroups, &nMuxes );
            assert( nGroups * nMuxes >= 2 );
            Str_NtkBalanceMux( pNew, p, pObj, vDelay, nLutSize, nGroups, nMuxes, fRecursive, fOptArea, fVerbose );
            pObj += nGroups * nMuxes - 1;
        }
        else if ( pObj->Type == STR_MUX )
        {
            pObj->iCopy = Gia_ManHashMuxReal( pNew, Str_ObjFaninCopy(p, pObj, 2), Str_ObjFaninCopy(p, pObj, 1), Str_ObjFaninCopy(p, pObj, 0) );
            Str_ObjDelay( pNew, Abc_Lit2Var(pObj->iCopy), nLutSize, vDelay );
        }
        else if ( pObj->Type == STR_PO )
        {
            pObj->iCopy = Gia_ManAppendCo( pNew, Str_ObjFaninCopy(p, pObj, 0) );
            arrTime = Vec_IntEntry(vDelay, Abc_Lit2Var(Str_ObjFaninCopy(p, pObj, 0)) );
            Delay = Abc_MaxInt( Delay, arrTime );
            if ( pGia->pManTime != NULL )
            {
                CioId = Gia_ObjCioId( Gia_ManObj(pNew, Abc_Lit2Var(pObj->iCopy)) );
                Tim_ManSetCoArrival( (Tim_Man_t *)pGia->pManTime, CioId, (float)arrTime );
            }
        }
        else if ( pObj->Type == STR_CONST0 )
            pObj->iCopy = 0, Vec_IntWriteEntry(vDelay, 0, 17);
        else assert( 0 );
    }
    if ( fVerbose )
        printf( "Max delay = %d.  Old objs = %d.  New objs = %d.\n", Delay >> 4, Gia_ManObjNum(pGia), Gia_ManObjNum(pNew) );
    Vec_IntFree( vDelay );
    ABC_FREE( pNew->vCopies.pArray );
    Gia_ManHashStop( pNew );
    Gia_ManSetRegNum( pNew, Gia_ManRegNum(pGia) );
    pNew = Gia_ManDupNoMuxes( pTemp = pNew, 0 );
    Gia_ManStop( pTemp );
//    if ( pGia->pManTime != NULL )
//        pNew->pManTime = Tim_ManDup( (Tim_Man_t *)pGia->pManTime, 0 );
    return pNew;
}